

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O3

iterator * __thiscall QTextBlock::iterator::operator--(iterator *this)

{
  uint uVar1;
  
  uVar1 = QFragmentMapData<QTextFragmentData>::previous(&(this->p->fragments).data,this->n);
  this->n = uVar1;
  if (uVar1 != this->b) {
    this->n = uVar1;
  }
  return this;
}

Assistant:

QTextBlock::iterator &QTextBlock::iterator::operator--()
{
    n = p->fragmentMap().previous(n);

    if (n == b)
        return *this;

    int formatIndex = p->fragmentMap().fragment(n)->format;
    int last = n;

    while (n != b && p->fragmentMap().fragment(n)->format != formatIndex) {
        last = n;
        n = p->fragmentMap().previous(n);
    }

    n = last;
    return *this;
}